

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<kj::ArrayPtr<const_unsigned_char>_> * __thiscall
kj::Array<kj::ArrayPtr<unsigned_char_const>>::attach<kj::Vector<kj::Array<unsigned_char>>>
          (Array<kj::ArrayPtr<const_unsigned_char>_> *__return_storage_ptr__,void *this,
          Vector<kj::Array<unsigned_char>_> *attachments)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  size_t sVar2;
  ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
  *this_00;
  ArrayPtr<const_unsigned_char> *pAVar3;
  
  pAVar1 = *this;
  sVar2 = *(size_t *)((long)this + 8);
  this_00 = (ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
             *)operator_new(0x40);
  kj::_::
  ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
  ::ArrayDisposableOwnedBundle
            (this_00,(Array<kj::ArrayPtr<const_unsigned_char>_> *)this,attachments);
  pAVar3 = (ArrayPtr<const_unsigned_char> *)0x1;
  if (pAVar1 != (ArrayPtr<const_unsigned_char> *)0x0) {
    pAVar3 = pAVar1;
  }
  __return_storage_ptr__->ptr = pAVar3;
  __return_storage_ptr__->size_ = sVar2;
  __return_storage_ptr__->disposer = (ArrayDisposer *)this_00;
  return __return_storage_ptr__;
}

Assistant:

Array<T> Array<T>::attach(Attachments&&... attachments) {
  T* ptrCopy = ptr;
  auto sizeCopy = size_;

  KJ_IREQUIRE(ptrCopy != nullptr, "cannot attach to null pointer");

  // HACK: If someone accidentally calls .attach() on a null pointer in opt mode, try our best to
  //   accomplish reasonable behavior: We turn the pointer non-null but still invalid, so that the
  //   disposer will still be called when the pointer goes out of scope.
  if (ptrCopy == nullptr) ptrCopy = reinterpret_cast<T*>(1);

  auto bundle = new _::ArrayDisposableOwnedBundle<Array<T>, Attachments...>(
      kj::mv(*this), kj::fwd<Attachments>(attachments)...);
  return Array<T>(ptrCopy, sizeCopy, *bundle);
}